

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_include_pattern_from_file_w
                  (archive *_a,wchar_t *pathname,wchar_t nullSeparator)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_include_pattern_from_file_w");
  if (iVar1 == -0x1e) {
    return L'\xffffffe2';
  }
  wVar2 = add_pattern_from_file
                    ((archive_match *)_a,(match_list *)&_a[1].file_count,L'\0',pathname,
                     nullSeparator);
  return wVar2;
}

Assistant:

int
archive_match_include_pattern_from_file_w(struct archive *_a,
    const wchar_t *pathname, int nullSeparator)
{
	struct archive_match *a;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_include_pattern_from_file_w");
	a = (struct archive_match *)_a;

	return add_pattern_from_file(a, &(a->inclusions), 0, pathname,
		nullSeparator);
}